

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O2

vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
license::LicenseGenerator::parseLicenseInfo
          (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
           *__return_storage_ptr__,variables_map *vm)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  string *to_date;
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  any *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint *puVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar7;
  tm *in_RCX;
  pointer product;
  allocator local_26a;
  allocator local_269;
  string client_signature;
  string extra_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  string local_200;
  ulong local_1e0;
  ulong local_1d8;
  string dt_end;
  string begin_date;
  string end_date;
  string local_90;
  undefined1 local_70 [64];
  
  std::__cxx11::string::string
            ((string *)&begin_date,FullLicenseInfo::UNUSED_TIME,(allocator *)&dt_end);
  std::__cxx11::string::string
            ((string *)&end_date,FullLicenseInfo::UNUSED_TIME,(allocator *)&dt_end);
  std::__cxx11::string::string((string *)&dt_end,"expire_date",(allocator *)&client_signature);
  this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          *)(vm + 0x10);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(this,&dt_end);
  std::__cxx11::string::~string((string *)&dt_end);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&client_signature,"expire_date",(allocator *)&extra_data)
    ;
    paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&client_signature);
    pbVar5 = boost::any_cast<std::__cxx11::string_const&>(paVar4);
    std::__cxx11::string::string((string *)&dt_end,(string *)pbVar5);
    std::__cxx11::string::~string((string *)&client_signature);
    normalize_date(&client_signature,&dt_end);
    std::__cxx11::string::operator=((string *)&end_date,(string *)&client_signature);
    std::__cxx11::string::~string((string *)&client_signature);
    extra_data._M_dataplus._M_p = (pointer)time((time_t *)0x0);
    in_RCX = localtime((time_t *)&extra_data);
    strftime((char *)&client_signature,0x14,"%Y-%m-%d",in_RCX);
    std::__cxx11::string::assign((char *)&begin_date);
    std::__cxx11::string::~string((string *)&dt_end);
  }
  std::__cxx11::string::string((string *)&dt_end,"begin_date",(allocator *)&client_signature);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(this,&dt_end);
  std::__cxx11::string::~string((string *)&dt_end);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&client_signature,"begin_date",(allocator *)&extra_data);
    paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&client_signature);
    pbVar5 = boost::any_cast<std::__cxx11::string_const&>(paVar4);
    std::__cxx11::string::string((string *)&dt_end,(string *)pbVar5);
    std::__cxx11::string::~string((string *)&client_signature);
    normalize_date(&client_signature,&dt_end);
    std::__cxx11::string::operator=((string *)&begin_date,(string *)&client_signature);
    std::__cxx11::string::~string((string *)&client_signature);
    std::__cxx11::string::~string((string *)&dt_end);
  }
  std::__cxx11::string::string((string *)&client_signature,"",(allocator *)&dt_end);
  std::__cxx11::string::string((string *)&dt_end,"client_signature",(allocator *)&extra_data);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(this,&dt_end);
  std::__cxx11::string::~string((string *)&dt_end);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&dt_end,"client_signature",(allocator *)&extra_data);
    paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    boost::any_cast<std::__cxx11::string_const&>(paVar4);
    std::__cxx11::string::_M_assign((string *)&client_signature);
    std::__cxx11::string::~string((string *)&dt_end);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&dt_end,
               "[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}",0x10);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&client_signature,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&dt_end,0);
    if (!bVar2) {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar7 = std::operator<<(poVar7,"Client signature not recognized: ");
      poVar7 = std::operator<<(poVar7,(string *)&client_signature);
      poVar7 = std::operator<<(poVar7,
                               " Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX");
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_0021532b;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&dt_end);
  }
  std::__cxx11::string::string((string *)&extra_data,"",(allocator *)&dt_end);
  std::__cxx11::string::string((string *)&dt_end,"extra_data",(allocator *)&local_200);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(this,&dt_end);
  std::__cxx11::string::~string((string *)&dt_end);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&dt_end,"extra_data",(allocator *)&local_200);
    paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    boost::any_cast<std::__cxx11::string_const&>(paVar4);
    std::__cxx11::string::_M_assign((string *)&extra_data);
    std::__cxx11::string::~string((string *)&dt_end);
  }
  std::__cxx11::string::string((string *)&dt_end,"start_version",(allocator *)&local_200);
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                            ((abstract_variables_map *)vm,(string *)&dt_end);
  puVar6 = boost::any_cast<unsigned_int_const&>(paVar4);
  local_1d8 = (ulong)*puVar6;
  std::__cxx11::string::~string((string *)&dt_end);
  std::__cxx11::string::string((string *)&dt_end,"end_version",(allocator *)&local_200);
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                            ((abstract_variables_map *)vm,(string *)&dt_end);
  puVar6 = boost::any_cast<unsigned_int_const&>(paVar4);
  local_1e0 = (ulong)*puVar6;
  std::__cxx11::string::~string((string *)&dt_end);
  std::__cxx11::string::string((string *)&dt_end,"product",(allocator *)&local_200);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(this,&dt_end);
  std::__cxx11::string::~string((string *)&dt_end);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&dt_end,"product",(allocator *)&local_200);
    paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    __x = boost::
          any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                    (paVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&products,__x);
    std::__cxx11::string::~string((string *)&dt_end);
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::reserve
              (__return_storage_ptr__,
               (long)products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    to_date = (string *)(local_70 + 0x20);
    for (product = products.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        product !=
        products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; product = product + 1) {
      std::locale::locale((locale *)&local_200);
      boost::algorithm::trim_copy<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt_end,
                 (algorithm *)product,&local_200,(locale *)in_RCX);
      sVar1 = dt_end._M_string_length;
      std::__cxx11::string::~string((string *)&dt_end);
      std::locale::~locale((locale *)&local_200);
      if (sVar1 != 0) {
        std::__cxx11::string::string((string *)&local_200,"",&local_269);
        std::__cxx11::string::string((string *)local_70,"",&local_26a);
        std::__cxx11::string::string((string *)&local_90,(string *)&begin_date);
        std::__cxx11::string::string((string *)to_date,(string *)&end_date);
        in_RCX = (tm *)local_70;
        FullLicenseInfo::FullLicenseInfo
                  ((FullLicenseInfo *)&dt_end,&local_200,product,(string *)in_RCX,0x6e,&local_90,
                   to_date,&client_signature,(uint)local_1d8,(uint)local_1e0,&extra_data);
        std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
        emplace_back<license::FullLicenseInfo>(__return_storage_ptr__,(FullLicenseInfo *)&dt_end);
        FullLicenseInfo::~FullLicenseInfo((FullLicenseInfo *)&dt_end);
        std::__cxx11::string::~string((string *)to_date);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string((string *)&local_200);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&products);
    std::__cxx11::string::~string((string *)&extra_data);
    std::__cxx11::string::~string((string *)&client_signature);
    std::__cxx11::string::~string((string *)&end_date);
    std::__cxx11::string::~string((string *)&begin_date);
    return __return_storage_ptr__;
  }
  poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar7 = std::operator<<(poVar7,"Parameter [product] not found. ");
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_0021532b:
  exit(2);
}

Assistant:

vector<FullLicenseInfo> LicenseGenerator::parseLicenseInfo(
		const po::variables_map& vm) {
	string begin_date = FullLicenseInfo::UNUSED_TIME;
	string end_date = FullLicenseInfo::UNUSED_TIME;
	if (vm.count("expire_date")) {
		const std::string dt_end = vm["expire_date"].as<string>();
		try {
			end_date = normalize_date(dt_end);
			char curdate[20];
			time_t curtime = time(NULL);
			strftime(curdate, 20, "%Y-%m-%d", localtime(&curtime));
			begin_date.assign(curdate);
		} catch (const invalid_argument &e) {
			cerr << endl << "End date not recognized: " << dt_end
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			exit(2);
		}
	}
	if (vm.count("begin_date")) {
		const std::string begin_date_str = vm["begin_date"].as<string>();
		try {
			begin_date = normalize_date(begin_date_str);
		} catch (invalid_argument &e) {
			cerr << endl << "Begin date not recognized: " << begin_date_str
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			//print_usage(vm);
			exit(2);
		}
	}
	string client_signature = "";
	if (vm.count("client_signature")) {
		client_signature = vm["client_signature"].as<string>();
		regex e("[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}");
		if (!regex_match(client_signature, e)) {
			cerr << endl << "Client signature not recognized: "
				<< client_signature
				<< " Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX"
				<< endl;
			exit(2);
		}
	}
	string extra_data = "";
	if (vm.count("extra_data")) {
		extra_data = vm["extra_data"].as<string>();
	}
	unsigned int from_sw_version = vm["start_version"].as<unsigned int>();
	unsigned int to_sw_version = vm["end_version"].as<unsigned int>();
	if (vm.count("product") == 0) {
		cerr << endl << "Parameter [product] not found. " << endl;
		exit(2);
	}
	vector<string> products = vm["product"].as<vector<string>>();
	vector<FullLicenseInfo> licInfo;
	licInfo.reserve(products.size());
	for (auto it = products.begin(); it != products.end(); it++) {
		if (boost::algorithm::trim_copy(*it).length() > 0) {
			licInfo.push_back(
					FullLicenseInfo("", *it, "", PROJECT_INT_VERSION,
							begin_date, end_date, client_signature,
							from_sw_version, to_sw_version, extra_data));
		}
	}
	return licInfo;
}